

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int exprMightBeIndexed(SrcList *pFrom,int *aiCurCol,Expr *pExpr,int op)

{
  int iVar1;
  uint uVar2;
  ExprList *in_RAX;
  Index *pIVar3;
  long lVar4;
  
  if ((op - 0x37U < 4) && (pExpr->op == 0xb1)) {
    in_RAX = (pExpr->x).pList;
    pExpr = in_RAX->a[0].pExpr;
  }
  if (pExpr->op == 0xa8) {
    *aiCurCol = pExpr->iTable;
    aiCurCol[1] = (int)pExpr->iColumn;
    iVar1 = 1;
  }
  else {
    if (0 < pFrom->nSrc) {
      lVar4 = 0;
      do {
        for (pIVar3 = (pFrom->a[lVar4].pSTab)->pIndex; pIVar3 != (Index *)0x0;
            pIVar3 = pIVar3->pNext) {
          if (pIVar3->aColExpr != (ExprList *)0x0) {
            uVar2 = exprMightBeIndexed2(pFrom,aiCurCol,pExpr,(int)lVar4);
            in_RAX = (ExprList *)(ulong)uVar2;
            break;
          }
        }
        if (pIVar3 != (Index *)0x0) {
          return (int)in_RAX;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < pFrom->nSrc);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int exprMightBeIndexed(
  SrcList *pFrom,        /* The FROM clause */
  int *aiCurCol,         /* Write the referenced table cursor & column here */
  Expr *pExpr,           /* An operand of a comparison operator */
  int op                 /* The specific comparison operator */
){
  int i;

  /* If this expression is a vector to the left or right of a
  ** inequality constraint (>, <, >= or <=), perform the processing
  ** on the first element of the vector.  */
  assert( TK_GT+1==TK_LE && TK_GT+2==TK_LT && TK_GT+3==TK_GE );
  assert( TK_IS<TK_GE && TK_ISNULL<TK_GE && TK_IN<TK_GE );
  assert( op<=TK_GE );
  if( pExpr->op==TK_VECTOR && (op>=TK_GT && ALWAYS(op<=TK_GE)) ){
    assert( ExprUseXList(pExpr) );
    pExpr = pExpr->x.pList->a[0].pExpr;
  }

  if( pExpr->op==TK_COLUMN ){
    aiCurCol[0] = pExpr->iTable;
    aiCurCol[1] = pExpr->iColumn;
    return 1;
  }

  for(i=0; i<pFrom->nSrc; i++){
    Index *pIdx;
    for(pIdx=pFrom->a[i].pSTab->pIndex; pIdx; pIdx=pIdx->pNext){
      if( pIdx->aColExpr ){
        return exprMightBeIndexed2(pFrom,aiCurCol,pExpr,i);
      }
    }
  }
  return 0;
}